

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O0

word zzAdd(word *c,word *a,word *b,size_t n)

{
  ulong uVar1;
  size_t i;
  word w;
  word carry;
  size_t n_local;
  word *b_local;
  word *a_local;
  word *c_local;
  
  carry = 0;
  for (i = 0; i < n; i = i + 1) {
    uVar1 = a[i] + carry;
    c[i] = uVar1 + b[i];
    carry = (word)(int)(uint)(c[i] < uVar1 || uVar1 < carry);
  }
  return carry;
}

Assistant:

word zzAdd(word c[], const word a[], const word b[], size_t n)
{
	register word carry = 0;
	register word w;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, c, n));
	ASSERT(wwIsSameOrDisjoint(b, c, n));
	for (i = 0; i < n; ++i)
	{
#ifndef SAFE_FAST
		w = a[i] + carry;
		carry = wordLess01(w, carry);
		c[i] = w + b[i];
		carry |= wordLess01(c[i], w);
#else
		w = a[i] + carry;
		if (w < carry)
			c[i] = b[i];
		else
			w += b[i], carry = w < b[i], c[i] = w;
#endif
	}
	w = 0;
	return carry;
}